

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dill_util.c
# Opt level: O2

int dill_getreg(dill_stream_conflict s,int typ)

{
  int iVar1;
  private_ctx pdVar2;
  vreg_info *pvVar3;
  
  pvVar3 = (vreg_info *)dill_realloc(s->p->vregs,(long)s->p->vreg_count * 0x2c + 0x2c);
  pdVar2 = s->p;
  pdVar2->vregs = pvVar3;
  iVar1 = pdVar2->vreg_count;
  pvVar3[iVar1].typ = typ;
  pvVar3[iVar1].use_info.use_count = 0;
  pvVar3[iVar1].use_info.def_count = 0;
  pvVar3[iVar1].offset = -0x21524111;
  pdVar2->vreg_count = iVar1 + 1;
  return iVar1 + 100;
}

Assistant:

extern int
dill_getreg(dill_stream s, int typ)
{
    s->p->vregs =
        realloc(s->p->vregs, (s->p->vreg_count + 1) * sizeof(vreg_info));
    s->p->vregs[s->p->vreg_count].typ = typ;
    s->p->vregs[s->p->vreg_count].use_info.use_count = 0;
    s->p->vregs[s->p->vreg_count].use_info.def_count = 0;
    s->p->vregs[s->p->vreg_count].offset = 0xdeadbeef;
    return ((s->p->vreg_count++) + 100);
}